

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

void dgn_growths(level *lev,boolean showmsg,boolean update)

{
  undefined1 *puVar1;
  byte *pbVar2;
  int iVar3;
  monst *pmVar4;
  xchar xVar5;
  xchar xVar6;
  level *lev_00;
  char cVar7;
  boolean bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  trap *ptVar15;
  obj *poVar16;
  char *pcVar17;
  byte bVar18;
  ulong uVar19;
  char *pcVar20;
  undefined7 in_register_00000011;
  char *pcVar21;
  undefined7 in_register_00000031;
  rm (*parVar22) [21];
  int iVar23;
  long lVar24;
  long lVar25;
  schar *psVar26;
  bool bVar27;
  coord pos;
  coord pos2;
  obj *in_stack_ffffffffffffff88;
  coord local_6d;
  xchar local_6b;
  coord local_6a;
  level *local_68;
  rm (*local_60) [21];
  undefined4 local_54;
  undefined4 local_50;
  xchar local_49;
  ulong local_48;
  long local_40;
  rm (*local_38) [21];
  
  local_50 = (undefined4)CONCAT71(in_register_00000011,update);
  local_54 = (undefined4)CONCAT71(in_register_00000031,showmsg);
  uVar10 = mt_random();
  local_6b = -1;
  local_49 = -1;
  rndmappos(&local_6b,&local_49);
  xVar6 = local_49;
  xVar5 = local_6b;
  local_60 = lev->locations;
  lVar25 = (long)local_6b;
  lVar24 = (long)local_49;
  cVar7 = lev->locations[lVar25][lVar24].typ;
  local_68 = lev;
  if (((cVar7 == '\r') || ((cVar7 == '\0' && ((*(uint *)&(lev->flags).field_0x8 & 0x100000) != 0))))
     && (('\x0e' < local_60[lVar25][lVar24].typ ||
         ((local_60[lVar25][lVar24].field_0x6 & 0x80) == 0)))) {
    uVar11 = mt_random();
    dtoxy(&local_6d,uVar11 & 7);
    local_6d.x = local_6d.x + xVar5;
    local_6d.y = local_6d.y + xVar6;
    uVar12 = mt_random();
    if (uVar12 * -0x55555555 < 0x55555556) {
      uVar12 = mt_random();
      dtoxy(&local_6a,uVar11 + (uVar12 & 1) & 7);
      local_6d.x = local_6d.x + local_6a.x;
      local_6d.y = local_6d.y + local_6a.y;
    }
    parVar22 = local_60;
    uVar14 = (ulong)(byte)local_6d.x;
    if ((byte)local_6d.y < 0x15 && (byte)(local_6d.x - 1U) < 0x4f) {
      uVar19 = (ulong)(byte)local_6d.y;
      if ((((((((local_60[uVar14][uVar19].field_0x7 & 4) != 0) &&
              ((viz_array[uVar19][uVar14] & 2U) == 0)) &&
             (cVar7 = inside_shop(local_68,local_6d.x,local_6d.y), cVar7 == '\0')) &&
            ((parVar22[uVar14][uVar19].typ & 0xfeU) == 0x18)) &&
           ((u.ux != local_6d.x || (u.uy != local_6d.y)))) &&
          ((pmVar4 = local_68->monsters[local_6d.x][local_6d.y], pmVar4 == (monst *)0x0 ||
           ((pmVar4->field_0x61 & 2) != 0)))) &&
         ((ptVar15 = t_at(local_68,(int)local_6d.x,(int)local_6d.y), ptVar15 == (trap *)0x0 &&
          (level->objects[local_6d.x][local_6d.y] == (obj *)0x0)))) {
        iVar13 = 0;
        uVar11 = (int)local_6d.x - 1;
        do {
          iVar23 = -1;
          do {
            if (((0x4e < uVar11 - 1) || (0x14 < (uint)(local_6d.y + iVar23))) ||
               (local_60[uVar11][(uint)(local_6d.y + iVar23)].typ < '\x18')) {
              iVar13 = iVar13 + 1;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 != 2);
          bVar27 = uVar11 != (int)local_6d.x + 1U;
          uVar11 = uVar11 + 1;
        } while (bVar27);
        if (iVar13 < 3) {
          parVar22[uVar14][uVar19].typ = '\r';
          puVar1 = &parVar22[uVar14][uVar19].field_0x6;
          *puVar1 = *puVar1 & 0xef;
          block_point((int)local_6d.x,(int)local_6d.y);
        }
      }
    }
  }
  iVar13 = herb_info[uVar10 & 3].herb;
  if (herb_info[uVar10 & 3].in_water == '\0') {
    local_6a.x = -1;
    local_6b = -1;
    rndmappos(&local_6a.x,&local_6b);
    xVar6 = local_6a.x;
    xVar5 = local_6b;
    poVar16 = sobj_at(iVar13,local_68,(int)local_6a.x,(int)local_6b);
    if ((poVar16 != (obj *)0x0) &&
       (bVar8 = herb_can_grow_at(local_68,xVar6,xVar5,'\0'), bVar8 != '\0')) {
      iVar23 = poVar16->quan;
      uVar10 = mt_random();
      if ((int)(uVar10 % 3) < iVar23) {
        iVar23 = 0;
        uVar10 = mt_random();
        uVar14 = (ulong)uVar10;
        local_48 = uVar14;
        do {
          dtoxy(&local_6d,(int)uVar14 + iVar23 & 7);
          local_6d.x = local_6d.x + xVar6;
          local_6d.y = local_6d.y + xVar5;
          if (((byte)local_6d.y < 0x15 && (byte)(local_6d.x - 1U) < 0x4f) &&
             (bVar8 = herb_can_grow_at(local_68,local_6d.x,local_6d.y,'\0'), bVar8 != '\0')) {
            poVar16 = sobj_at(iVar13,local_68,(int)local_6d.x,(int)local_6d.y);
            lev_00 = local_68;
            if (poVar16 == (obj *)0x0) {
              poVar16 = mksobj(local_68,iVar13,'\x01','\0');
              poVar16->quan = 1;
              uVar10 = weight(poVar16);
              poVar16->owt = uVar10;
              place_object(poVar16,lev_00,(int)local_6d.x,(int)local_6d.y);
              if ((char)local_50 != '\0') {
                newsym((int)local_6d.x,(int)local_6d.y);
              }
              if ((((viz_array[local_6d.y][local_6d.x] & 2U) != 0) && ((char)local_54 != '\0')) &&
                 (flags.verbose != '\0')) {
                if (iVar13 == 0x11d) {
                  pcVar17 = "some garlic";
                }
                else {
                  pcVar17 = xname(poVar16);
                  pcVar17 = an(pcVar17);
                }
                pcVar21 = surface((int)local_6d.x,(int)local_6d.y);
                Norep("Suddenly you notice %s growing on the %s.",pcVar17,pcVar21);
              }
              break;
            }
            iVar3 = poVar16->quan;
            uVar10 = mt_random();
            uVar14 = local_48;
            if (iVar3 <= (int)(uVar10 % 3)) goto LAB_001a11d6;
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 != 8);
      }
      else {
        poVar16->quan = poVar16->quan + 1;
        uVar10 = weight(poVar16);
        poVar16->owt = uVar10;
      }
    }
  }
  else {
    local_6d.x = 0xff;
    local_6a.x = -1;
    rndmappos(&local_6d.x,&local_6a.x);
    xVar6 = local_6a.x;
    xVar5 = local_6d.x;
    poVar16 = sobj_at(iVar13,local_68,(int)local_6d.x,(int)local_6a.x);
    if ((poVar16 != (obj *)0x0) &&
       (bVar8 = herb_can_grow_at(local_68,xVar5,xVar6,'\x01'), bVar8 != '\0')) {
LAB_001a11d6:
      poVar16->quan = poVar16->quan + 1;
      uVar10 = weight(poVar16);
      poVar16->owt = uVar10;
    }
  }
  uVar10 = mt_random();
  if ((uVar10 * -0x11111111 >> 1 | (uint)((uVar10 * -0x11111111 & 1) != 0) << 0x1f) < 0x8888889) {
    local_6a.x = -1;
    local_6b = -1;
    rndmappos(&local_6a.x,&local_6b);
    xVar5 = local_6b;
    local_48 = (ulong)local_6a.x;
    lVar24 = (long)local_6b;
    parVar22 = local_60 + local_48;
    cVar7 = (*parVar22)[lVar24].typ;
    if ((((cVar7 == '\r') ||
         ((cVar7 == '\0' && ((*(uint *)&(local_68->flags).field_0x8 & 0x100000) != 0)))) &&
        (uVar10 = *(uint *)&(*parVar22)[lVar24].field_0x6, (uVar10 & 0x10) == 0)) &&
       ('\x0e' < cVar7 || -1 < (char)uVar10)) {
      iVar13 = 0;
      local_40 = lVar24 * 3;
      local_38 = parVar22;
      uVar10 = mt_random();
      do {
        dtoxy(&local_6d,uVar10 + iVar13 & 7);
        parVar22 = local_60;
        bVar9 = local_6d.x + (char)local_48;
        bVar18 = local_6d.y + xVar5;
        local_6d.x = bVar9;
        local_6d.y = bVar18;
        if ((0x4e < (byte)(bVar9 - 1)) || (0x14 < bVar18)) break;
        cVar7 = local_60[bVar9][bVar18].typ;
        if (('\x17' < cVar7 || (byte)(cVar7 - 0x11U) < 4) &&
           (poVar16 = rnd_treefruit_at((uint)bVar9,(uint)bVar18), poVar16 != (obj *)0x0)) {
          poVar16->quan = 1;
          uVar10 = weight(poVar16);
          poVar16->owt = uVar10;
          obj_extract_self(poVar16);
          if ((char)local_54 != '\0') {
            psVar26 = &parVar22[bVar9][bVar18].typ;
            if ((viz_array[local_6d.y][local_6d.x] & 2U) == 0) {
              if ((viz_array[lVar24][local_48] & 2U) == 0) {
                iVar13 = dist2((int)local_6d.x,(int)local_6d.y,(int)u.ux,(int)u.uy);
                if ((iVar13 < 9) && (poVar16->otyp != 0x115)) {
                  cVar7 = *psVar26;
                  pcVar17 = "splut";
                  if ((byte)(cVar7 - 0x11U) < 4) {
                    pcVar17 = "plop";
                  }
                  if (cVar7 == '\x1c') {
                    pcVar17 = "plop";
                  }
                  You_hear("a %s!",pcVar17);
                }
                goto LAB_001a18d6;
              }
              pcVar17 = "Something";
            }
            else {
              pcVar17 = xname(poVar16);
              pcVar17 = An(pcVar17);
            }
            bVar27 = (viz_array[lVar24][local_48] & 2U) == 0;
            pcVar21 = "the tree";
            if (bVar27) {
              pcVar21 = "somewhere";
            }
            pcVar20 = "";
            if (((!bVar27) && (bVar9 = *psVar26, '\x10' < (char)bVar9)) &&
               (pcVar20 = "", bVar9 < 0x15)) {
              pcVar20 = " into the water";
            }
            Norep("%s falls from %s%s.",pcVar17,pcVar21,pcVar20);
          }
LAB_001a18d6:
          place_object(poVar16,local_68,(int)local_6d.x,(int)local_6d.y);
          stackobj(in_stack_ffffffffffffff88);
          uVar10 = mt_random();
          if (0x2aaaaaaa <
              (uVar10 * -0x55555555 >> 1 | (uint)((uVar10 * -0x55555555 & 1) != 0) << 0x1f)) {
            pbVar2 = &(*local_38)[0].field_0x6 + local_40 * 4;
            *pbVar2 = *pbVar2 | 0x10;
          }
          if ((char)local_50 != '\0') {
            newsym((int)local_6d.x,(int)local_6d.y);
          }
          break;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 8);
    }
  }
  uVar11 = mt_random();
  bVar8 = on_level(&local_68->z,&dungeon_topology.d_water_level);
  uVar10 = 200;
  if (bVar8 == '\0') {
    uVar10 = 0x19;
  }
  local_6a.x = -1;
  local_6b = -1;
  rndmappos(&local_6a.x,&local_6b);
  dtoxy(&local_6d,uVar11 & 7);
  xVar6 = local_6a.x;
  xVar5 = local_6b;
  lVar25 = (long)local_6a.x;
  local_6d.x = local_6d.x + local_6a.x;
  lVar24 = (long)local_6b;
  local_6d.y = local_6d.y + local_6b;
  if ((((byte)local_6d.y < 0x15 && (byte)(local_6d.x - 1U) < 0x4f) &&
      ((byte)(local_60[lVar25][lVar24].typ - 0x11U) < 4)) &&
     (((byte)(local_60[(byte)local_6d.x][(byte)local_6d.y].typ - 0x11U) < 4 &&
      ((poVar16 = local_68->objects[lVar25][lVar24], poVar16 != (obj *)0x0 &&
       (poVar16->where == '\x01')))))) {
    if (1 < poVar16->quan) {
      poVar16 = splitobj(poVar16,(ulong)(poVar16->quan - 1));
    }
    if (uVar10 < poVar16->owt) {
      stackobj(in_stack_ffffffffffffff88);
    }
    else {
      if ((((char)local_54 != '\0') && ((u._1052_1_ & 2) != 0)) &&
         (((viz_array[local_6d.y][local_6d.x] & 2U) != 0 || ((viz_array[lVar24][lVar25] & 2U) != 0))
         )) {
        pcVar17 = xname(poVar16);
        pcVar17 = An(pcVar17);
        if ((viz_array[lVar24][lVar25] & 2U) == 0) {
          pcVar21 = " towards you";
        }
        else {
          pcVar21 = "";
          if ((viz_array[local_6d.y][local_6d.x] & 2U) == 0) {
            pcVar21 = " away from you";
          }
        }
        pcVar20 = " the currents of";
        if (flags.verbose == '\0') {
          pcVar20 = "";
        }
        Norep("%s floats%s in%s the murky water.",pcVar17,pcVar21,pcVar20);
      }
      obj_extract_self(poVar16);
      place_object(poVar16,local_68,(int)local_6d.x,(int)local_6d.y);
      stackobj(in_stack_ffffffffffffff88);
      if ((char)local_50 != '\0') {
        newsym((int)xVar6,(int)xVar5);
        newsym((int)local_6d.x,(int)local_6d.y);
      }
    }
  }
  return;
}

Assistant:

void dgn_growths(struct level *lev, boolean showmsg, boolean update)
{
	int herbnum = rn2(SIZE(herb_info));
	seed_tree(lev, -1, -1);
	if (herb_info[herbnum].in_water)
	    grow_water_herbs(herb_info[herbnum].herb, lev, -1, -1);
	else
	    grow_herbs(herb_info[herbnum].herb, lev, -1, -1, showmsg, update);
	if (!rn2(30))
	    drop_ripe_treefruit(lev, -1, -1, showmsg, update);
	water_current(lev, -1, -1, rn2(8),
		      Is_waterlevel(&lev->z) ? 200 : 25, showmsg, update);
}